

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupContextWindow(bool also_over_items,char *str_id,int mouse_button)

{
  bool bVar1;
  char *pcStack_18;
  int mouse_button_local;
  char *str_id_local;
  bool also_over_items_local;
  
  pcStack_18 = str_id;
  if (str_id == (char *)0x0) {
    pcStack_18 = "window_context_menu";
  }
  bVar1 = IsMouseHoveringWindow();
  if (((bVar1) && (bVar1 = IsMouseClicked(mouse_button,false), bVar1)) &&
     ((also_over_items || (bVar1 = IsAnyItemHovered(), !bVar1)))) {
    OpenPopupEx(pcStack_18,true);
  }
  bVar1 = BeginPopup(pcStack_18);
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextWindow(bool also_over_items, const char* str_id, int mouse_button)
{
    if (!str_id) str_id = "window_context_menu";
    if (IsMouseHoveringWindow() && IsMouseClicked(mouse_button))
        if (also_over_items || !IsAnyItemHovered())
            OpenPopupEx(str_id, true);
    return BeginPopup(str_id);
}